

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O1

bool __thiscall duckdb::AsOfLocalState::Sink(AsOfLocalState *this,DataChunk *input)

{
  DataChunk *pDVar1;
  idx_t count;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_type *psVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  _Head_base<0UL,_bool_*,_false> _Var5;
  sel_t *psVar6;
  reference this_01;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long uVar10;
  ulong uVar11;
  size_type *psVar12;
  idx_t count_p;
  UnifiedVectorFormat unified;
  UnifiedVectorFormat local_78;
  
  pDVar1 = &this->lhs_keys;
  DataChunk::Reset(pDVar1);
  ExpressionExecutor::Execute(&this->lhs_executor,input,pDVar1);
  DataChunk::Flatten(pDVar1);
  count = input->count;
  (this->lhs_valid_mask).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)0x0;
  (this->lhs_valid_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  this_00 = (this->lhs_valid_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
            .
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->lhs_valid_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->lhs_valid_mask).super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
  psVar12 = (this->op->null_sensitive).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  psVar2 = (this->op->null_sensitive).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar12 != psVar2) {
    do {
      this_01 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,*psVar12);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
      Vector::ToUnifiedFormat(this_01,count,&local_78);
      ValidityMask::Combine(&this->lhs_valid_mask,&local_78.validity,count);
      if (local_78.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      psVar12 = psVar12 + 1;
    } while (psVar12 != psVar2);
  }
  if ((this->left_outer).enabled == true) {
    switchD_00570541::default
              ((this->left_outer).found_match.super_unique_ptr<bool[],_std::default_delete<bool[]>_>
               ._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
               super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
               super__Head_base<0UL,_bool_*,_false>._M_head_impl,0,(this->left_outer).count);
  }
  if (count + 0x3f < 0x40) {
    count_p = 0;
  }
  else {
    puVar3 = (this->lhs_valid_mask).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    psVar4 = (this->lhs_sel).sel_vector;
    count_p = 0;
    uVar7 = 0;
    uVar8 = 0;
    do {
      if (puVar3 == (unsigned_long *)0x0) {
        uVar10 = 0xffffffffffffffff;
      }
      else {
        uVar10 = puVar3[uVar7];
      }
      uVar11 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar11 = count;
      }
      uVar9 = uVar11;
      if (uVar10 != 0) {
        uVar9 = uVar8;
        if (uVar10 == 0xffffffffffffffff) {
          if (uVar8 < uVar11) {
            _Var5._M_head_impl =
                 (this->left_outer).found_match.
                 super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
                 super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                 super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                 super__Head_base<0UL,_bool_*,_false>._M_head_impl;
            do {
              psVar4[count_p] = (sel_t)uVar9;
              if ((this->left_outer).enabled == true) {
                _Var5._M_head_impl[uVar9] = true;
              }
              uVar9 = uVar9 + 1;
              count_p = count_p + 1;
            } while (uVar11 != uVar9);
          }
        }
        else if (uVar8 < uVar11) {
          psVar6 = (this->lhs_sel).sel_vector;
          _Var5._M_head_impl =
               (this->left_outer).found_match.super_unique_ptr<bool[],_std::default_delete<bool[]>_>
               ._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
               super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
               super__Head_base<0UL,_bool_*,_false>._M_head_impl;
          uVar9 = 0;
          do {
            if ((uVar10 >> (uVar9 & 0x3f) & 1) != 0) {
              psVar6[count_p] = (int)uVar8 + (int)uVar9;
              count_p = count_p + 1;
              if ((this->left_outer).enabled == true) {
                _Var5._M_head_impl[uVar9 + uVar8] = true;
              }
            }
            uVar9 = uVar9 + 1;
          } while ((uVar8 - uVar11) + uVar9 != 0);
          uVar9 = uVar8 + uVar9;
        }
      }
      uVar7 = uVar7 + 1;
      uVar8 = uVar9;
    } while (uVar7 != count + 0x3f >> 6);
  }
  pDVar1 = &this->lhs_payload;
  DataChunk::Reset(pDVar1);
  if (count_p == count) {
    DataChunk::Reference(pDVar1,input);
    (this->lhs_payload).count = input->count;
  }
  else {
    DataChunk::Slice(pDVar1,input,&this->lhs_sel,count_p,0);
    (this->lhs_payload).count = count_p;
    this->fetch_next_left = false;
  }
  optional_ptr<duckdb::PartitionLocalSinkState,_true>::CheckValid(&this->lhs_partition_sink);
  PartitionLocalSinkState::Sink((this->lhs_partition_sink).ptr,pDVar1);
  return false;
}

Assistant:

bool AsOfLocalState::Sink(DataChunk &input) {
	//	Compute the join keys
	lhs_keys.Reset();
	lhs_executor.Execute(input, lhs_keys);
	lhs_keys.Flatten();

	//	Combine the NULLs
	const auto count = input.size();
	lhs_valid_mask.Reset();
	for (auto col_idx : op.null_sensitive) {
		auto &col = lhs_keys.data[col_idx];
		UnifiedVectorFormat unified;
		col.ToUnifiedFormat(count, unified);
		lhs_valid_mask.Combine(unified.validity, count);
	}

	//	Convert the mask to a selection vector
	//	and mark all the rows that cannot match for early return.
	idx_t lhs_valid = 0;
	const auto entry_count = lhs_valid_mask.EntryCount(count);
	idx_t base_idx = 0;
	left_outer.Reset();
	for (idx_t entry_idx = 0; entry_idx < entry_count;) {
		const auto validity_entry = lhs_valid_mask.GetValidityEntry(entry_idx++);
		const auto next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
		if (ValidityMask::AllValid(validity_entry)) {
			for (; base_idx < next; ++base_idx) {
				lhs_sel.set_index(lhs_valid++, base_idx);
				left_outer.SetMatch(base_idx);
			}
		} else if (ValidityMask::NoneValid(validity_entry)) {
			base_idx = next;
		} else {
			const auto start = base_idx;
			for (; base_idx < next; ++base_idx) {
				if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
					lhs_sel.set_index(lhs_valid++, base_idx);
					left_outer.SetMatch(base_idx);
				}
			}
		}
	}

	//	Slice the keys to the ones we can match
	lhs_payload.Reset();
	if (lhs_valid == count) {
		lhs_payload.Reference(input);
		lhs_payload.SetCardinality(input);
	} else {
		lhs_payload.Slice(input, lhs_sel, lhs_valid);
		lhs_payload.SetCardinality(lhs_valid);

		//	Flush the ones that can't match
		fetch_next_left = false;
	}

	lhs_partition_sink->Sink(lhs_payload);

	return false;
}